

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int RebootSeanet(SEANET *pSeanet)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  undefined1 local_98 [8];
  CHRONO chrono;
  uchar local_48 [4];
  int nbdatabytes;
  uchar databuf [22];
  uint8 local_26 [8];
  uchar reqbuf [14];
  SEANET *pSeanet_local;
  
  builtin_memcpy(local_26,"@0008\b",7);
  local_26[7] = 0xff;
  reqbuf[0] = '\x02';
  reqbuf[1] = '\x03';
  reqbuf[2] = '\x10';
  reqbuf[3] = 0x80;
  reqbuf[4] = '\x02';
  reqbuf[5] = '\n';
  chrono._68_4_ = 0;
  reqbuf._6_8_ = pSeanet;
  iVar1 = WriteAllRS232Port(&pSeanet->RS232Port,local_26,0xe);
  if (iVar1 == 0) {
    mSleep(1000);
    StartChrono((CHRONO *)local_98);
    do {
      dVar3 = GetTimeElapsedChronoQuick((CHRONO *)local_98);
      if (30.0 < dVar3) {
        printf("Error reading data from a Seanet : Reboot timeout. \n");
        return 2;
      }
      memset(local_48,0,0x16);
      chrono._68_4_ = 0;
      iVar1 = GetLatestMsgSeanet((SEANET *)reqbuf._6_8_,4,local_48,0x16,(int *)&chrono.field_0x44);
      if (iVar1 != 0) {
        printf("A Seanet is not responding correctly. \n");
        return 1;
      }
      *(uint *)(reqbuf._6_8_ + 0x380) = (uint)databuf[0xc];
      bVar2 = true;
      if (((databuf[0xc] & 2) != 0) && (bVar2 = true, (databuf[0xc] & 4) == 0)) {
        bVar2 = (databuf[0xc] & 0x80) != 0;
      }
    } while (bVar2);
    pSeanet_local._4_4_ = 0;
  }
  else {
    printf("Error writing data to a Seanet. \n");
    pSeanet_local._4_4_ = 1;
  }
  return pSeanet_local._4_4_;
}

Assistant:

inline int RebootSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','8',0x08,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x03,mtReboot,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,MESSAGE_TERMINATOR_SEANET};
	unsigned char databuf[22];
	int nbdatabytes = 0;
	CHRONO chrono;

	// Send mtReboot message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	mSleep(1000); // Wait for the device to reboot.

	StartChrono(&chrono);

	// Check mtAlive message HeadInf byte with Transducer Centred (bit 1=1), not Motoring (bit 2=0), not SentCfg (bit 7=0).
	do
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_REBOOT_SEANET)
		{
			printf("Error reading data from a Seanet : Reboot timeout. \n");
			return EXIT_TIMEOUT;
		}

		// Wait for a mtAlive message. It should come every 1 second.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		if (GetLatestMsgSeanet(pSeanet, mtAlive, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}

		// HeadInf.
		pSeanet->HeadInf = (unsigned char)databuf[20];

		//printf("mtAlive message databuf[20]=%#x\n", (int)databuf[20]);
	}
	while (!(databuf[20]&0x02)||(databuf[20]&0x04)||(databuf[20]&0x80));

	return EXIT_SUCCESS;
}